

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_ems_add_serverhello(SSL_HANDSHAKE *hs,CBB *out)

{
  int iVar1;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  if ((*(uint *)&hs->field_0x6c8 >> 0x11 & 1) == 0) {
    hs_local._7_1_ = true;
  }
  else {
    iVar1 = CBB_add_u16(out,0x17);
    if ((iVar1 != 0) && (iVar1 = CBB_add_u16(out,0), iVar1 != 0)) {
      return true;
    }
    hs_local._7_1_ = false;
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_ems_add_serverhello(SSL_HANDSHAKE *hs, CBB *out) {
  if (!hs->extended_master_secret) {
    return true;
  }

  if (!CBB_add_u16(out, TLSEXT_TYPE_extended_master_secret) ||
      !CBB_add_u16(out, 0 /* length */)) {
    return false;
  }

  return true;
}